

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalHashJoin,duckdb::LogicalComparisonJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::vector<duckdb::JoinCondition,true>,duckdb::JoinType&,duckdb::vector<unsigned_long,true>&,duckdb::vector<unsigned_long,true>&,duckdb::vector<duckdb::LogicalType,true>,unsigned_long&,duckdb::unique_ptr<duckdb::JoinFilterPushdownInfo,std::default_delete<duckdb::JoinFilterPushdownInfo>,true>>
          (PhysicalPlan *this,LogicalComparisonJoin *args,PhysicalOperator *args_1,
          PhysicalOperator *args_2,vector<duckdb::JoinCondition,_true> *args_3,JoinType *args_4,
          vector<unsigned_long,_true> *args_5,vector<unsigned_long,_true> *args_6,
          vector<duckdb::LogicalType,_true> *args_7,unsigned_long *args_8,
          unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
          *args_9)

{
  pointer *pprVar1;
  JoinType join_type;
  idx_t estimated_cardinality;
  iterator __position;
  PhysicalHashJoin *this_00;
  _Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false> local_88;
  PhysicalOperator *local_80;
  PhysicalOperator *local_78;
  reference_wrapper<duckdb::PhysicalOperator> local_70;
  vector<duckdb::LogicalType,_true> local_68;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> local_48;
  
  local_80 = args_1;
  local_78 = args_2;
  this_00 = (PhysicalHashJoin *)ArenaAllocator::AllocateAligned(&this->arena,0x180);
  local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_start =
       (args_3->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (args_3->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (args_3->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args_3->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_3->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_3->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  join_type = *args_4;
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_7->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_7->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_7->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args_7->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_7->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_7->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  estimated_cardinality = *args_8;
  local_88._M_head_impl =
       (args_9->
       super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
       .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl;
  (args_9->
  super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
  .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl =
       (JoinFilterPushdownInfo *)0x0;
  PhysicalHashJoin::PhysicalHashJoin
            (this_00,(LogicalOperator *)args,local_80,local_78,
             (vector<duckdb::JoinCondition,_true> *)&local_48,join_type,args_5,args_6,&local_68,
             estimated_cardinality,
             (unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
              *)&local_88);
  if (local_88._M_head_impl != (JoinFilterPushdownInfo *)0x0) {
    ::std::default_delete<duckdb::JoinFilterPushdownInfo>::operator()
              ((default_delete<duckdb::JoinFilterPushdownInfo> *)&local_88,local_88._M_head_impl);
  }
  local_88._M_head_impl = (JoinFilterPushdownInfo *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector(&local_48);
  __position._M_current =
       (this->ops).
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->ops).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_70._M_data = (PhysicalOperator *)this_00;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&this->ops,__position,&local_70);
  }
  else {
    (__position._M_current)->_M_data = (PhysicalOperator *)this_00;
    pprVar1 = &(this->ops).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return (PhysicalOperator *)this_00;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}